

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

uint64_t fio_siphash_xy(void *data,size_t len,size_t x,size_t y,uint64_t key1,uint64_t key2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  uVar2 = key1 ^ 0x7469686173716475;
  uVar9 = key2 ^ 0x6b617f6d656e6665;
  uVar8 = key1 ^ 0x6b7f62616d677361;
  uVar4 = key2 ^ 0x7b6b696e727e6c7b;
  sVar6 = len;
  if (7 < len) {
    do {
      uVar3 = *data;
      uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      uVar4 = uVar4 ^ uVar3;
      sVar12 = x;
      if (x != 0) {
        do {
          uVar2 = uVar2 + uVar9;
          uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2;
          uVar5 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8 + uVar4;
          uVar8 = uVar8 + uVar4 + uVar9;
          uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar5;
          uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar8;
          uVar4 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ uVar2;
          uVar8 = uVar8 << 0x20 | uVar8 >> 0x20;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      uVar2 = uVar2 ^ uVar3;
      data = (void *)((long)data + 8);
      sVar6 = sVar6 - 8;
    } while (7 < sVar6);
  }
  local_98 = 0;
  local_b0 = 0;
  local_a8 = 0;
  local_a0 = 0;
  local_88 = 0;
  local_90 = 0;
  local_80 = 0;
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uVar11 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  uVar3 = sVar6;
  uVar5 = sVar6;
  uVar1 = 0;
  uVar7 = sVar6;
  uVar10 = sVar6;
  uVar13 = sVar6;
  local_40 = sVar6;
  switch(sVar6) {
  case 7:
    local_98 = (ulong)*(byte *)((long)data + 6) << 0x30;
  case 6:
    local_b0 = (ulong)*(byte *)((long)data + 5) << 0x28;
  case 5:
    local_a0 = (ulong)*(byte *)((long)data + 4) << 0x20;
    local_a8 = local_b0;
  case 4:
    local_80 = (ulong)*(byte *)((long)data + 3) << 0x18;
    local_88 = local_a8;
    local_90 = local_a0;
  case 3:
    uVar11 = (ulong)*(byte *)((long)data + 2) << 0x10;
    local_68 = local_88;
    local_70 = local_90;
    local_78 = local_80;
  case 2:
    local_48 = local_68;
    local_50 = local_70;
    local_58 = local_78;
    uVar1 = (ulong)*(byte *)((long)data + 1) << 8;
    local_60 = uVar11;
  case 1:
    sVar6 = uVar1;
    local_40 = (ulong)(byte)*data;
    uVar3 = local_50;
    uVar5 = local_60;
    uVar7 = local_98;
    uVar10 = local_48;
    uVar13 = local_58;
  case 0:
    local_40 = (len << 0x38 | uVar7 | uVar10 | uVar3 | uVar13) & 0xffffffffff000000 |
               (uVar5 | sVar6) & 0xffffffffffffff00 | local_40;
    uVar4 = uVar4 ^ local_40;
    uVar3 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8 + uVar4;
    uVar2 = uVar2 + uVar9;
    uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2;
    uVar8 = uVar8 + uVar4 + uVar9;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar3;
    uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar8;
    uVar4 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar2;
    uVar8 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8;
    uVar2 = uVar2 + uVar9;
    uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2;
    uVar8 = uVar8 + uVar9;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar8;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 ^ local_40;
    uVar8 = (uVar8 << 0x20 | uVar8 >> 0x20) ^ 0xff;
    if (y != 0) {
      do {
        uVar2 = uVar2 + uVar9;
        uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2;
        uVar3 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8 + uVar4;
        uVar8 = uVar8 + uVar4 + uVar9;
        uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar3;
        uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar8;
        uVar4 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar2;
        uVar8 = uVar8 << 0x20 | uVar8 >> 0x20;
        y = y - 1;
      } while (y != 0);
    }
    uVar3 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8 + uVar4;
    uVar2 = uVar2 + uVar9;
    uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2;
    uVar8 = uVar8 + uVar4 + uVar9;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar3;
    uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar8;
    uVar4 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar2;
    uVar8 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8;
    uVar2 = uVar2 + uVar9;
    uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2;
    uVar8 = uVar8 + uVar9;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar8;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar8 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar4;
    uVar2 = uVar2 + uVar9;
    uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8;
    uVar8 = uVar8 + uVar9;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar8;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar8 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar8;
    uVar2 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar2 + uVar9;
    uVar8 = uVar8 + uVar2;
    return (uVar8 << 0x20 | uVar8 >> 0x20) ^
           (uVar4 << 0x15 | uVar4 >> 0x2b) ^ (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar8;
  }
}

Assistant:

static inline uint64_t fio_siphash_xy(const void *data, size_t len, size_t x,
                                      size_t y, uint64_t key1, uint64_t key2) {
  /* initialize the 4 words */
  uint64_t v0 = (0x0706050403020100ULL ^ 0x736f6d6570736575ULL) ^ key1;
  uint64_t v1 = (0x0f0e0d0c0b0a0908ULL ^ 0x646f72616e646f6dULL) ^ key2;
  uint64_t v2 = (0x0706050403020100ULL ^ 0x6c7967656e657261ULL) ^ key1;
  uint64_t v3 = (0x0f0e0d0c0b0a0908ULL ^ 0x7465646279746573ULL) ^ key2;
  const uint8_t *w8 = data;
  uint8_t len_mod = len & 255;
  union {
    uint64_t i;
    uint8_t str[8];
  } word;

#define hash_map_SipRound                                                      \
  do {                                                                         \
    v2 += v3;                                                                  \
    v3 = fio_lrot64(v3, 16) ^ v2;                                              \
    v0 += v1;                                                                  \
    v1 = fio_lrot64(v1, 13) ^ v0;                                              \
    v0 = fio_lrot64(v0, 32);                                                   \
    v2 += v1;                                                                  \
    v0 += v3;                                                                  \
    v1 = fio_lrot64(v1, 17) ^ v2;                                              \
    v3 = fio_lrot64(v3, 21) ^ v0;                                              \
    v2 = fio_lrot64(v2, 32);                                                   \
  } while (0);

  while (len >= 8) {
    word.i = sip_local64(fio_str2u64(w8));
    v3 ^= word.i;
    /* Sip Rounds */
    for (size_t i = 0; i < x; ++i) {
      hash_map_SipRound;
    }
    v0 ^= word.i;
    w8 += 8;
    len -= 8;
  }
  word.i = 0;
  uint8_t *pos = word.str;
  switch (len) { /* fallthrough is intentional */
  case 7:
    pos[6] = w8[6];
    /* fallthrough */
  case 6:
    pos[5] = w8[5];
    /* fallthrough */
  case 5:
    pos[4] = w8[4];
    /* fallthrough */
  case 4:
    pos[3] = w8[3];
    /* fallthrough */
  case 3:
    pos[2] = w8[2];
    /* fallthrough */
  case 2:
    pos[1] = w8[1];
    /* fallthrough */
  case 1:
    pos[0] = w8[0];
  }
  word.str[7] = len_mod;

  /* last round */
  v3 ^= word.i;
  hash_map_SipRound;
  hash_map_SipRound;
  v0 ^= word.i;
  /* Finalization */
  v2 ^= 0xff;
  /* d iterations of SipRound */
  for (size_t i = 0; i < y; ++i) {
    hash_map_SipRound;
  }
  hash_map_SipRound;
  hash_map_SipRound;
  hash_map_SipRound;
  hash_map_SipRound;
  /* XOR it all together */
  v0 ^= v1 ^ v2 ^ v3;
#undef hash_map_SipRound
  return v0;
}